

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<double,true>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  DynamicObjectFlags DVar6;
  undefined4 *puVar7;
  Var pvVar8;
  ulong uVar9;
  ulong uVar10;
  SparseArraySegmentBase *value;
  SparseArraySegmentBase *value_00;
  Var local_58;
  
  DVar6 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar6 & HasNoMissingValues) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar3) goto LAB_00b972f5;
    *puVar7 = 0;
  }
  pSVar1 = (this->super_JavascriptArray).head.ptr;
  uVar9 = (ulong)pSVar1->length;
  if (pSVar1->length != (this->super_JavascriptArray).super_ArrayObject.length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar3) goto LAB_00b972f5;
    *puVar7 = 0;
  }
  if ((pSVar1->next).ptr == (SparseArraySegmentBase *)0x0) {
    value = *(SparseArraySegmentBase **)(pSVar1 + 1);
    bVar3 = uVar9 != 0;
    if (bVar3) {
      uVar10 = 1;
      value_00 = value;
      do {
        value = (&pSVar1->next)[uVar10].ptr;
        bVar4 = NumberUtilities::IsNan((double)value);
        if (bVar4) {
          local_58 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).nan.ptr;
          value = value_00;
        }
        else if (findMax) {
          if ((double)value <= (double)value_00) {
LAB_00b97241:
            value = value_00;
          }
        }
        else if (((double)value_00 <= (double)value) &&
                ((((double)value != 0.0 || (NAN((double)value))) ||
                 (bVar5 = NumberUtilities::IsSpecial((double)value_00,0x8000000000000000), !bVar5)))
                ) goto LAB_00b97241;
        if (bVar4) break;
        bVar3 = uVar10 < uVar9;
        bVar4 = uVar10 != uVar9;
        uVar10 = uVar10 + 1;
        value_00 = value;
      } while (bVar4);
    }
    if (!bVar3) {
      pvVar8 = JavascriptNumber::ToVarNoCheck((double)value,scriptContext);
      return pvVar8;
    }
    return local_58;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0xa2b,"(false)",
                              "FindMinOrMax currently supports native arrays with only one segment")
  ;
  if (bVar3) {
    *puVar7 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00b972f5:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }